

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::log
          (ansicolor_sink<spdlog::details::console_mutex> *this,double __x)

{
  pointer pfVar1;
  reference s;
  size_t end;
  size_t sVar2;
  long in_RSI;
  double extraout_XMM0_Qa;
  basic_string_view<char> local_168 [2];
  allocator<char> local_141;
  undefined1 local_140 [8];
  memory_buf_t formatted;
  lock_guard<std::mutex> lock;
  log_msg *msg_local;
  ansicolor_sink<spdlog::details::console_mutex> *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)(formatted.store_ + 0xf8),this->mutex_);
  *(undefined8 *)(in_RSI + 0x28) = 0;
  *(undefined8 *)(in_RSI + 0x30) = 0;
  std::allocator<char>::allocator();
  fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_140,&local_141);
  std::allocator<char>::~allocator(&local_141);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     (&this->formatter_);
  (*pfVar1->_vptr_formatter[2])(pfVar1,in_RSI,local_140);
  if (((this->should_do_colors_ & 1U) == 0) ||
     (*(ulong *)(in_RSI + 0x30) <= *(ulong *)(in_RSI + 0x28))) {
    sVar2 = fmt::v10::detail::buffer<char>::size((buffer<char> *)local_140);
    print_range_(this,(memory_buf_t *)local_140,0,sVar2);
  }
  else {
    print_range_(this,(memory_buf_t *)local_140,0,*(size_t *)(in_RSI + 0x28));
    s = std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
        ::at(&this->colors_,(long)*(int *)(in_RSI + 0x10));
    fmt::v10::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>(local_168,s);
    print_ccode_(this,local_168);
    print_range_(this,(memory_buf_t *)local_140,*(size_t *)(in_RSI + 0x28),
                 *(size_t *)(in_RSI + 0x30));
    print_ccode_(this,&this->reset);
    sVar2 = *(size_t *)(in_RSI + 0x30);
    end = fmt::v10::detail::buffer<char>::size((buffer<char> *)local_140);
    print_range_(this,(memory_buf_t *)local_140,sVar2,end);
  }
  fflush((FILE *)this->target_file_);
  fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_140);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)(formatted.store_ + 0xf8));
  return extraout_XMM0_Qa;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::log(const details::log_msg &msg) {
    // Wrap the originally formatted message in color codes.
    // If color is not supported in the terminal, log as is instead.
    std::lock_guard<mutex_t> lock(mutex_);
    msg.color_range_start = 0;
    msg.color_range_end = 0;
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    if (should_do_colors_ && msg.color_range_end > msg.color_range_start) {
        // before color range
        print_range_(formatted, 0, msg.color_range_start);
        // in color range
        print_ccode_(colors_.at(static_cast<size_t>(msg.level)));
        print_range_(formatted, msg.color_range_start, msg.color_range_end);
        print_ccode_(reset);
        // after color range
        print_range_(formatted, msg.color_range_end, formatted.size());
    } else  // no color
    {
        print_range_(formatted, 0, formatted.size());
    }
    fflush(target_file_);
}